

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::AsmJsByteCodeWriter::AsmStartCall
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,ArgSlot ArgCount,bool isPatching)

{
  ArgSlot local_2a [4];
  OpLayoutStartCall data;
  
  ByteCodeWriter::CheckOpen(&this->super_ByteCodeWriter);
  local_2a[0] = ArgCount;
  ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)0>
            (&(this->super_ByteCodeWriter).m_byteCodeData,op,local_2a,2,&this->super_ByteCodeWriter,
             isPatching);
  return;
}

Assistant:

void AsmJsByteCodeWriter::AsmStartCall(OpCodeAsmJs op, ArgSlot ArgCount, bool isPatching)
    {
        CheckOpen();

        OpLayoutStartCall data;
        data.ArgCount = ArgCount;
        m_byteCodeData.Encode(op, &data, sizeof(data), this, isPatching);
    }